

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

nng_err nng_pipe_close(nng_pipe p)

{
  nni_pipe *local_20;
  nni_pipe *pipe;
  uint32_t local_10;
  nng_err rv;
  nng_pipe p_local;
  
  local_10 = p.id;
  pipe._4_4_ = nni_pipe_find(&local_20,p.id);
  rv = pipe._4_4_;
  if (pipe._4_4_ == NNG_OK) {
    nni_pipe_close(local_20);
    nni_pipe_rele(local_20);
    rv = NNG_OK;
  }
  return rv;
}

Assistant:

nng_err
nng_pipe_close(nng_pipe p)
{
	nng_err   rv;
	nni_pipe *pipe;

	if ((rv = nni_pipe_find(&pipe, p.id)) != 0) {
		return (rv);
	}
	nni_pipe_close(pipe);
	nni_pipe_rele(pipe);
	return (NNG_OK);
}